

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_statemachine(Curl_easy *data,connectdata *conn)

{
  _Bool local_49;
  size_t local_40;
  size_t nread;
  pingpong *pp;
  pop3_conn *pop3c;
  int pop3code;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pop3c._4_4_ = CURLE_OK;
  nread = (size_t)&conn->proto;
  local_40 = 0;
  pp = (pingpong *)nread;
  _pop3code = conn;
  conn_local = (connectdata *)data;
  if ((conn->proto).pop3c.state == POP3_UPGRADETLS) {
    data_local._4_4_ = pop3_perform_upgrade_tls(data,conn);
  }
  else if ((conn->proto).ftpc.pp.sendleft == 0) {
    do {
      pop3c._4_4_ = Curl_pp_readresp((Curl_easy *)conn_local,0,(pingpong *)nread,(int *)&pop3c,
                                     &local_40);
      if (pop3c._4_4_ != CURLE_OK) {
        return pop3c._4_4_;
      }
      if ((int)pop3c == 0) break;
      switch((int)pp[1].nread_resp) {
      case 1:
        pop3c._4_4_ = pop3_state_servergreet_resp
                                ((Curl_easy *)conn_local,(int)pop3c,(pop3state)pp[1].nread_resp);
        break;
      case 2:
        pop3c._4_4_ = pop3_state_capa_resp
                                ((Curl_easy *)conn_local,(int)pop3c,(pop3state)pp[1].nread_resp);
        break;
      case 3:
        pop3c._4_4_ = pop3_state_starttls_resp
                                ((Curl_easy *)conn_local,_pop3code,(int)pop3c,
                                 (pop3state)pp[1].nread_resp);
        break;
      default:
        pop3_state((Curl_easy *)conn_local,POP3_STOP);
        break;
      case 5:
        pop3c._4_4_ = pop3_state_auth_resp
                                ((Curl_easy *)conn_local,(int)pop3c,(pop3state)pp[1].nread_resp);
        break;
      case 6:
        pop3c._4_4_ = pop3_state_apop_resp
                                ((Curl_easy *)conn_local,(int)pop3c,(pop3state)pp[1].nread_resp);
        break;
      case 7:
        pop3c._4_4_ = pop3_state_user_resp
                                ((Curl_easy *)conn_local,(int)pop3c,(pop3state)pp[1].nread_resp);
        break;
      case 8:
        pop3c._4_4_ = pop3_state_pass_resp
                                ((Curl_easy *)conn_local,(int)pop3c,(pop3state)pp[1].nread_resp);
        break;
      case 9:
        pop3c._4_4_ = pop3_state_command_resp
                                ((Curl_easy *)conn_local,(int)pop3c,(pop3state)pp[1].nread_resp);
        break;
      case 10:
        pop3_state((Curl_easy *)conn_local,POP3_STOP);
      }
      local_49 = false;
      if ((pop3c._4_4_ == CURLE_OK) && (local_49 = false, (int)pp[1].nread_resp != 0)) {
        local_49 = Curl_pp_moredata((pingpong *)nread);
      }
    } while (local_49 != false);
    data_local._4_4_ = pop3c._4_4_;
  }
  else {
    data_local._4_4_ = Curl_pp_flushsend(data,(pingpong *)nread);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode pop3_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;
  (void)data;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(data, conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

 do {
    /* Read the response from the server */
   result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &pop3code, &nread);
   if(result)
     return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(data, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(data, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(data, conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH:
      result = pop3_state_auth_resp(data, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_DIGEST_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(data, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(data, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(data, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(data, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      pop3_state(data, POP3_STOP);
      break;

    default:
      /* internal error */
      pop3_state(data, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}